

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

void bmpmask32toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  OPJ_UINT32 OVar8;
  int iVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  OPJ_UINT8 *pOVar16;
  OPJ_UINT32 OVar17;
  uint uVar18;
  byte bVar19;
  byte bVar20;
  int iVar21;
  uint in_stack_00000010;
  
  lVar11 = CONCAT44(in_register_0000000c,redMask);
  bVar19 = 0;
  bVar20 = 0;
  iVar10 = 0;
  if (greenMask != 0) {
    iVar10 = 0;
    uVar13 = (ulong)greenMask;
    bVar20 = 0;
    if ((greenMask & 1) == 0) {
      bVar20 = 0;
      uVar13 = (ulong)greenMask;
      OVar8 = greenMask;
      do {
        uVar13 = uVar13 >> 1;
        bVar20 = bVar20 + 1;
        uVar2 = OVar8 & 2;
        OVar8 = (OPJ_UINT32)uVar13;
      } while (uVar2 == 0);
    }
    do {
      iVar10 = iVar10 + 1;
      uVar7 = uVar13 & 2;
      uVar13 = uVar13 >> 1;
    } while (uVar7 != 0);
  }
  iVar21 = 0;
  if (blueMask != 0) {
    iVar21 = 0;
    uVar13 = (ulong)blueMask;
    bVar19 = 0;
    if ((blueMask & 1) == 0) {
      bVar19 = 0;
      uVar13 = (ulong)blueMask;
      OVar8 = blueMask;
      do {
        uVar13 = uVar13 >> 1;
        bVar19 = bVar19 + 1;
        uVar2 = OVar8 & 2;
        OVar8 = (OPJ_UINT32)uVar13;
      } while (uVar2 == 0);
    }
    do {
      iVar21 = iVar21 + 1;
      uVar7 = uVar13 & 2;
      uVar13 = uVar13 >> 1;
    } while (uVar7 != 0);
  }
  bVar14 = 0;
  iVar15 = 0;
  if (alphaMask != 0) {
    iVar15 = 0;
    OVar8 = alphaMask;
    bVar14 = 0;
    if ((alphaMask & 1) == 0) {
      bVar14 = 0;
      OVar17 = alphaMask;
      do {
        OVar8 = OVar17 >> 1;
        bVar14 = bVar14 + 1;
        uVar2 = OVar17 & 2;
        OVar17 = OVar8;
      } while (uVar2 == 0);
    }
    uVar13 = (ulong)OVar8;
    do {
      uVar13 = uVar13 >> 1;
      iVar15 = iVar15 + 1;
      uVar2 = OVar8 & 2;
      OVar8 = (OPJ_UINT32)uVar13;
    } while (uVar2 != 0);
  }
  bVar12 = 0;
  iVar9 = 0;
  if (in_stack_00000010 != 0) {
    iVar9 = 0;
    bVar12 = 0;
    uVar2 = in_stack_00000010 & 1;
    uVar18 = in_stack_00000010;
    while (uVar2 == 0) {
      bVar12 = bVar12 + 1;
      uVar2 = uVar18 & 2;
      uVar18 = uVar18 >> 1;
    }
    uVar13 = (ulong)uVar18;
    do {
      uVar13 = uVar13 >> 1;
      iVar9 = iVar9 + 1;
      uVar2 = uVar18 & 2;
      uVar18 = (uint)uVar13;
    } while (uVar2 != 0);
  }
  uVar2 = *(uint *)(lVar11 + 8);
  iVar3 = *(int *)(lVar11 + 0xc);
  *(int *)(lVar11 + 0x1c) = iVar10;
  *(int *)(lVar11 + 0x18) = iVar10;
  *(int *)(lVar11 + 0x5c) = iVar21;
  *(int *)(lVar11 + 0x58) = iVar21;
  *(int *)(lVar11 + 0x9c) = iVar15;
  *(int *)(lVar11 + 0x98) = iVar15;
  if (3 < (uint)image) {
    *(int *)(lVar11 + 0xdc) = iVar9;
    *(int *)(lVar11 + 0xd8) = iVar9;
  }
  if (iVar3 != 0) {
    pOVar16 = pData + (iVar3 + -1) * stride;
    iVar21 = 0;
    iVar10 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        lVar1 = (long)iVar21 * 4;
        lVar4 = *(long *)(lVar11 + 0x30);
        lVar5 = *(long *)(lVar11 + 0x70);
        lVar6 = *(long *)(lVar11 + 0xb0);
        iVar21 = iVar21 + uVar2;
        uVar13 = 0;
        do {
          iVar15 = (int)uVar13;
          uVar18 = CONCAT13(pOVar16[iVar15 + 3],
                            CONCAT12(pOVar16[iVar15 + 2],
                                     CONCAT11(pOVar16[iVar15 + 1],pOVar16[uVar13 & 0xffffffff])));
          *(uint *)(lVar4 + lVar1 + uVar13) = (uVar18 & greenMask) >> (bVar20 & 0x1f);
          *(uint *)(lVar5 + lVar1 + uVar13) = (uVar18 & blueMask) >> (bVar19 & 0x1f);
          *(uint *)(lVar6 + lVar1 + uVar13) = (uVar18 & alphaMask) >> (bVar14 & 0x1f);
          if (3 < (uint)image) {
            *(uint *)(uVar13 + *(long *)(lVar11 + 0xf0) + lVar1) =
                 (uVar18 & in_stack_00000010) >> (bVar12 & 0x1f);
          }
          uVar13 = uVar13 + 4;
        } while ((ulong)uVar2 * 4 - uVar13 != 0);
      }
      pOVar16 = pOVar16 + -(ulong)stride;
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar3);
  }
  return;
}

Assistant:

static void bmpmask32toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].bpp = redPrec;
    image->comps[0].prec = redPrec;
    image->comps[1].bpp = greenPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].bpp = bluePrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].bpp = alphaPrec;
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[4 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[4 * x + 1]) <<  8;
            value |= ((OPJ_UINT32)pSrc[4 * x + 2]) << 16;
            value |= ((OPJ_UINT32)pSrc[4 * x + 3]) << 24;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}